

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

int split_left_right(SXML_CHAR *str,SXML_CHAR sep,int *l0,int *l1,int *i_sep,int *r0,int *r1,
                    int ignore_spaces,int ignore_quotes)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  SXML_CHAR *pSVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  
  if (str == (SXML_CHAR *)0x0) {
    return 0;
  }
  if (i_sep != (int *)0x0) {
    *i_sep = -1;
  }
  if (ignore_spaces == 0) {
    uVar7 = 0xffffffff;
    bVar13 = 0;
    pSVar4 = str;
    do {
      cVar1 = *pSVar4;
      uVar7 = uVar7 + 1;
      uVar11 = 0;
      ignore_quotes = 0;
      uVar10 = uVar7;
      if (cVar1 == '\0') {
        bVar13 = 0;
        break;
      }
      pSVar4 = pSVar4 + 1;
    } while (cVar1 != sep);
  }
  else {
    bVar13 = *str;
    if ((char)bVar13 < '\x01') {
      uVar11 = 0;
    }
    else {
      ppuVar3 = __ctype_b_loc();
      uVar11 = 0;
      do {
        if ((*(byte *)((long)*ppuVar3 + (ulong)bVar13 * 2 + 1) & 0x20) == 0) break;
        bVar13 = str[uVar11 + 1];
        uVar11 = uVar11 + 1;
      } while ('\0' < (char)bVar13);
    }
    uVar7 = (uint)uVar11;
    if ((ignore_quotes == 0) || ((bVar13 != 0x27 && (bVar13 != 0x22)))) {
      uVar5 = uVar11 & 0xffffffff;
      bVar13 = str[uVar5];
      if (bVar13 != sep && bVar13 != 0) {
        pbVar8 = (byte *)(str + uVar5);
        while ((pbVar8 = pbVar8 + 1, (char)bVar13 < '\0' ||
               (ppuVar3 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar3 + (ulong)bVar13 * 2 + 1) & 0x20) == 0))) {
          uVar7 = uVar7 + 1;
          bVar13 = *pbVar8;
          if ((bVar13 == 0) || (bVar13 == sep)) break;
        }
        uVar5 = (ulong)uVar7;
        bVar13 = str[uVar5];
      }
      uVar10 = uVar7;
      if ('\0' < (char)bVar13) {
        ppuVar3 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar3 + (ulong)bVar13 * 2 + 1) & 0x20) == 0) {
            uVar10 = (uint)uVar5;
            break;
          }
          uVar10 = uVar10 + 1;
          bVar13 = str[uVar5 + 1];
          uVar5 = uVar5 + 1;
        } while ('\0' < (char)bVar13);
      }
      bVar13 = 0;
    }
    else {
      bVar14 = str[(long)(int)uVar7 + 1];
      uVar11 = (long)(int)uVar7 + 1;
      uVar7 = (uint)uVar11;
      uVar5 = uVar11;
      if ((bVar14 != 0) && (bVar14 != bVar13)) {
        uVar5 = uVar11 & 0xffffffff;
        do {
          if (bVar14 == 0x5c) {
            iVar2 = (int)uVar5;
            uVar5 = (long)iVar2 + 1;
            uVar7 = (uint)uVar5;
            if (str[(long)iVar2 + 1] == '\0') break;
          }
          bVar14 = str[(long)(int)uVar5 + 1];
          uVar5 = (long)(int)uVar5 + 1;
          uVar7 = (uint)uVar5;
          if ((bVar14 == 0) || (bVar14 == bVar13)) break;
        } while( true );
      }
      do {
        uVar6 = uVar5;
        cVar1 = str[uVar6 + 1];
        if ((long)cVar1 < 1) break;
        ppuVar3 = __ctype_b_loc();
        uVar5 = uVar6 + 1;
      } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      uVar10 = (int)uVar6 + 1;
    }
  }
  if (l0 != (int *)0x0) {
    *l0 = (int)uVar11;
  }
  if (l1 != (int *)0x0) {
    *l1 = uVar7 - 1;
  }
  if (i_sep != (int *)0x0) {
    *i_sep = uVar10;
  }
  lVar12 = (long)(int)uVar10;
  if ((str[lVar12] == '\0') || (bVar14 = str[lVar12 + 1], bVar14 == 0)) {
    if (r0 != (int *)0x0) {
      *r0 = uVar10;
    }
    if (r1 != (int *)0x0) {
      *r1 = uVar10 - 1;
    }
    if (i_sep == (int *)0x0) {
      return 1;
    }
    *i_sep = -(uint)(str[lVar12] == '\0') | uVar10;
    return 1;
  }
  uVar11 = lVar12 + 1;
  if (ignore_spaces != 0) {
    if ('\0' < (char)bVar14) {
      ppuVar3 = __ctype_b_loc();
      pbVar8 = (byte *)(str + uVar11);
      do {
        pbVar8 = pbVar8 + 1;
        if ((*(byte *)((long)*ppuVar3 + (ulong)bVar14 * 2 + 1) & 0x20) == 0) break;
        uVar11 = (ulong)((int)uVar11 + 1);
        bVar14 = *pbVar8;
      } while ('\0' < (char)bVar14);
    }
    iVar2 = (int)uVar11;
    if ((ignore_quotes != 0) && ((bVar14 == 0x27 || (bVar14 == 0x22)))) goto LAB_00106162;
  }
  iVar2 = (int)uVar11;
  bVar14 = bVar13;
LAB_00106162:
  bVar13 = str[(long)iVar2 + 1];
  uVar5 = (long)iVar2 + 1;
  uVar11 = uVar5 & 0xffffffff;
  if (bVar13 != 0) {
    uVar11 = uVar5 & 0xffffffff;
    do {
      iVar2 = (int)uVar11;
      if ((ignore_quotes != 0) && (bVar13 == bVar14)) goto LAB_001061a6;
      if (bVar13 == 0x5c) {
        lVar12 = (long)iVar2;
        uVar11 = lVar12 + 1;
        iVar2 = (int)uVar11;
        if (str[lVar12 + 1] == '\0') break;
      }
      bVar13 = str[(long)iVar2 + 1];
      uVar11 = (long)iVar2 + 1;
    } while (bVar13 != 0);
  }
  iVar2 = (int)uVar11;
  if (ignore_quotes != 0) {
LAB_001061a6:
    if (str[iVar2] != bVar14) {
      return 0;
    }
    uVar11 = (ulong)(iVar2 - 1);
  }
  uVar7 = (uint)uVar11;
  if (ignore_spaces == 0) {
    pcVar9 = str + (int)uVar7;
    do {
      pcVar9 = pcVar9 + 1;
      uVar7 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar7;
    } while (*pcVar9 != '\0');
  }
  if (r0 != (int *)0x0) {
    *r0 = (int)uVar5;
  }
  if (r1 != (int *)0x0) {
    *r1 = uVar7;
  }
  return 1;
}

Assistant:

int split_left_right(SXML_CHAR* str, SXML_CHAR sep, int* l0, int* l1, int* i_sep, int* r0, int* r1, int ignore_spaces, int ignore_quotes)
{
	int n0, n1, is;
	SXML_CHAR quote = '\0';

	if (str == NULL)
		return FALSE;

	if (i_sep != NULL)
		*i_sep = -1;

	if (!ignore_spaces) /* No sense of ignore quotes if spaces are to be kept */
		ignore_quotes = FALSE;

	/* Parse left part */

	if (ignore_spaces) {
		for (n0 = 0; str[n0] != NULC && sx_isspace(str[n0]); n0++) ; /* Skip head spaces, n0 points to first non-space */
		if (ignore_quotes && isquote(str[n0])) { /* If quote is found, look for next one */
			quote = str[n0++]; /* Quote can be '\'' or '"' */
			for (n1 = n0; str[n1] != NULC && str[n1] != quote; n1++) {
				if (str[n1] == C2SX('\\') && str[++n1] == NULC)
					break; /* Escape character (can be the last) */
			}
			for (is = n1 + 1; str[is] != NULC && sx_isspace(str[is]); is++) ; /* '--' not to take quote into account */
		} else {
			for (n1 = n0; str[n1] != NULC && str[n1] != sep && !sx_isspace(str[n1]); n1++) ; /* Search for separator or a space */
			for (is = n1; str[is] != NULC && sx_isspace(str[is]); is++) ;
		}
	} else {
		n0 = 0;
		for (n1 = 0; str[n1] != NULC && str[n1] != sep; n1++) ; /* Search for separator only */
		is = n1;
	}

	/* Here 'n0' is the start of left member, 'n1' is the character after the end of left member */

	if (l0 != NULL)
		*l0 = n0;
	if (l1 != NULL)
		*l1 = n1 - 1;
	if (i_sep != NULL)
		*i_sep = is;
	if (str[is] == NULC || str[is+1] == NULC) { /* No separator => empty right member */
		if (r0 != NULL)
			*r0 = is;
		if (r1 != NULL)
			*r1 = is-1;
		if (i_sep != NULL)
			*i_sep = (str[is] == NULC ? -1 : is);
		return TRUE;
	}

	/* Parse right part */

	n0 = is + 1;
	if (ignore_spaces) {
		for (; str[n0] != NULC && sx_isspace(str[n0]); n0++) ;
		if (ignore_quotes && isquote(str[n0]))
			quote = str[n0];
	}

	for (n1 = ++n0; str[n1]; n1++) {
		if (ignore_quotes && str[n1] == quote) /* Quote was reached */
			break;
		if (str[n1] == C2SX('\\') && str[++n1] == NULC) /* Escape character (can be the last) */
			break;
	}
	if (ignore_quotes && str[n1--] != quote) /* Quote is not the same than earlier, '--' is not to take it into account */
		return FALSE;
	if (!ignore_spaces)
		while (str[++n1]) ; /* Jump down the end of the string */

	if (r0 != NULL)
		*r0 = n0;
	if (r1 != NULL)
		*r1 = n1;

	return TRUE;
}